

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

string * __thiscall
lest::to_string<char_const*,std::__cxx11::string>
          (string *__return_storage_ptr__,lest *this,char **lhs,string *op,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  ostringstream os;
  string local_1e0;
  string local_1c0;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  __s = *(char **)this;
  if (__s == (char *)0x0) {
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    local_1c0.field_2._M_allocated_capacity._0_5_ = 0x6c6c756e7b;
    local_1c0.field_2._M_allocated_capacity._5_3_ = 0x747320;
    local_1c0.field_2._8_5_ = 0x7d676e6972;
    local_1c0._M_string_length = 0xd;
    local_1c0.field_2._M_local_buf[0xd] = '\0';
  }
  else {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,__s,__s + sVar1);
    make_strg_string(&local_1c0,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,*lhs,(long)lhs[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  make_strg_string(&local_1e0,op);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,
                    CONCAT35(local_1c0.field_2._M_allocated_capacity._5_3_,
                             local_1c0.field_2._M_allocated_capacity._0_5_) + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

auto to_string( L const & lhs, std::string op, R const & rhs ) -> std::string
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}